

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_1::RenderingContext::initGLFunctions(RenderingContext *this,Functions *gl)

{
  EglTestContext *this_00;
  ApiType local_28;
  deUint32 local_24;
  char *local_20;
  char *extensions [1];
  Functions *gl_local;
  RenderingContext *this_local;
  
  local_20 = "GL_KHR_robustness";
  this_00 = this->m_eglTestCtx;
  extensions[0] = (char *)gl;
  local_28.m_bits = (deUint32)attribListToContextType(this->m_attribList);
  local_24 = (deUint32)glu::ContextType::getAPI((ContextType *)&local_28);
  EglTestContext::initGLFunctions(this_00,gl,(ApiType)local_24,1,&local_20);
  return;
}

Assistant:

void RenderingContext::initGLFunctions (glw::Functions *gl)
{
	const char* extensions[] = { "GL_KHR_robustness" };
	m_eglTestCtx.initGLFunctions(gl, attribListToContextType(m_attribList).getAPI(), DE_LENGTH_OF_ARRAY(extensions), &extensions[0]);
}